

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fak_algorithm.c
# Opt level: O3

void fak_c(void)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  solver_state_c s;
  int local_168 [4];
  long local_158;
  long local_150;
  long local_140;
  long local_138;
  long local_130;
  long local_128;
  long local_120;
  long local_118;
  long local_110;
  long local_100;
  undefined4 *local_f8;
  undefined4 *local_f0;
  undefined4 *local_e8;
  
  setup_simple_state_c(&two_dof_robot_c,local_168);
  *local_f8 = 0;
  local_f8[1] = 0x3ff00000;
  local_f8[2] = 0;
  local_f8[3] = 0x3ff00000;
  *local_f0 = 0;
  local_f0[1] = 0x3ff00000;
  local_f0[2] = 0;
  local_f0[3] = 0x3ff00000;
  *local_e8 = 0;
  local_e8[1] = 0x3ff00000;
  local_e8[2] = 0;
  local_e8[3] = 0x3ff00000;
  lVar5 = (long)local_168[0];
  if (0 < lVar5) {
    lVar3 = 0x10;
    lVar4 = 0;
    lVar2 = 0;
    lVar6 = 0;
    do {
      lVar7 = _gc_acc_twist_accumulate + lVar3;
      lVar5 = (long)*(int *)(_gc_acc_twist_accumulate + lVar3) * 0x40;
      (**(code **)(&kcc_joint + lVar5))(lVar7,(long)local_f8 + lVar4,local_158 + lVar6);
      gc_pose_compose(local_158 + lVar6,_gc_acc_twist_accumulate + lVar3 + -0x10,local_150 + lVar6);
      (**(code **)(gc_acc_twist_tf_ref_to_tgt + lVar5))
                (lVar7,(long)local_f0 + lVar4,local_140 + lVar6);
      gc_twist_tf_ref_to_tgt(local_150 + lVar6,local_130 + lVar6,local_138 + lVar6);
      lVar1 = lVar6 + 0x10;
      gc_twist_accumulate(local_138 + lVar6,local_140 + lVar6,local_130 + lVar1);
      (**(code **)(&two_dof_robot_a + lVar5))(lVar7,(long)local_e8 + lVar4,local_128 + lVar6);
      (**(code **)(&two_dof_robot_c + lVar5))
                (lVar7,local_130 + lVar1,(long)local_f0 + lVar4,local_120 + lVar6);
      gc_acc_twist_add(local_128 + lVar6,local_120 + lVar6,local_118 + lVar6);
      gc_acc_twist_tf_ref_to_tgt(local_150 + lVar6,local_100 + lVar6,local_110 + lVar6);
      gc_acc_twist_accumulate(local_110 + lVar6,lVar6 + local_118,local_100 + lVar1);
      lVar5 = (long)local_168[0];
      lVar2 = lVar2 + 1;
      lVar4 = lVar4 + 8;
      lVar3 = lVar3 + 0x90;
      lVar6 = lVar1;
    } while (lVar2 < lVar5);
  }
  gc_acc_twist_log(lVar5 * 0x10 + local_100);
  return;
}

Assistant:

void fak_c()
{
    struct kcc_kinematic_chain *kc = &two_dof_robot_c;
    struct solver_state_c s;

    setup_simple_state_c(kc, &s);

    s.q[0] = 1.0;
    s.q[1] = 1.0;
    s.qd[0] = 1.0;
    s.qd[1] = 1.0;
    s.qdd[0] = 1.0;
    s.qdd[1] = 1.0;


    for (int i = 1; i < s.nbody + 1; i++) {
        struct kcc_joint *joint = &kc->segment[i - 1].joint;
        int joint_type = joint->type;

        // Position
        //

        // X_{J,i}
        kcc_joint[joint_type].fpk(joint, &s.q[i - 1], &s.x_jnt[i - 1]);

        // i^X_{i-1} = X_{J,i} X_{T,i}
        gc_pose_compose(&s.x_jnt[i - 1], &kc->segment[i - 1].joint_attachment, &s.x_rel[i - 1]);


        // Velocity
        //

        // Xd_{J,i} = S qd
        kcc_joint[joint_type].fvk(joint, &s.qd[i - 1], &s.xd_jnt[i - 1]);

        // Xd_{i-1}' = i^X_{i-1} Xd_{i-1}
        gc_twist_tf_ref_to_tgt(&s.x_rel[i - 1], &s.xd[i - 1], &s.xd_tf[i - 1]);

        // Xd_i = Xd_{i-1}' + Xd_{J,i}
        gc_twist_accumulate(&s.xd_tf[i - 1], &s.xd_jnt[i - 1], &s.xd[i]);


        // Acceleration
        //

        // Xdd_{J,i} = S_i qdd_i
        kcc_joint[joint_type].fak(joint, &s.qdd[i - 1], &s.xdd_jnt[i - 1]);

        // Xdd_{bias,i} = S_i qdd_i + Sd_i qd_i + Xd_i x S_i qd_i
        kcc_joint[joint_type].inertial_acceleration(joint, &s.xd[i], &s.qd[i - 1], &s.xdd_bias[i - 1]);

        // Xdd_{J,i}' = Xdd_{J,i} + Xdd_{bias,i}
        gc_acc_twist_add(&s.xdd_jnt[i - 1], &s.xdd_bias[i - 1], &s.xdd_net[i - 1]);

        // Xdd_{i-1}' = i^X_{i-1} Xdd_{i-1}
        gc_acc_twist_tf_ref_to_tgt(&s.x_rel[i - 1], &s.xdd[i - 1], &s.xdd_tf[i - 1]);

        // Xdd_i = Xdd_{i-1}' + Xdd_{J,i}'
        gc_acc_twist_accumulate(&s.xdd_tf[i - 1], &s.xdd_net[i - 1], &s.xdd[i]);
    }

    gc_acc_twist_log(&s.xdd[s.nbody]);
}